

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lundump.c
# Opt level: O2

void luaU_header(lu_byte *h)

{
  builtin_memcpy(h,"\x1bLuaR",6);
  builtin_memcpy(h + 6,"\x01\x04\b\x04\b",6);
  h[0xc] = '\x19';
  h[0xd] = 0x93;
  h[0xe] = '\r';
  h[0xf] = '\n';
  h[0x10] = '\x1a';
  h[0x11] = '\n';
  return;
}

Assistant:

void luaU_header (lu_byte* h)
{
 int x=1;
 memcpy(h,LUA_SIGNATURE,sizeof(LUA_SIGNATURE)-sizeof(char));
 h+=sizeof(LUA_SIGNATURE)-sizeof(char);
 *h++=cast_byte(VERSION);
 *h++=cast_byte(FORMAT);
 *h++=cast_byte(*(char*)&x);			/* endianness */
 *h++=cast_byte(sizeof(int));
 *h++=cast_byte(sizeof(size_t));
 *h++=cast_byte(sizeof(Instruction));
 *h++=cast_byte(sizeof(lua_Number));
 *h++=cast_byte(((lua_Number)0.5)==0);		/* is lua_Number integral? */
 memcpy(h,LUAC_TAIL,sizeof(LUAC_TAIL)-sizeof(char));
}